

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::logTestInfo(MakeCurrentPerfCase *this)

{
  TestLog *log_00;
  MessageBuilder *pMVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  MessageBuilder local_ca8;
  unsigned_long local_b28;
  MessageBuilder local_b20;
  size_type local_9a0;
  MessageBuilder local_998;
  size_type local_818;
  MessageBuilder local_810;
  MessageBuilder local_690;
  MessageBuilder local_510;
  size_type local_390;
  MessageBuilder local_388;
  size_type local_208;
  MessageBuilder local_200;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ScopedLogSection local_20;
  ScopedLogSection section;
  TestLog *log;
  MakeCurrentPerfCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  section.m_log = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Test Info",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Test case information.",&local_79);
  tcu::ScopedLogSection::ScopedLogSection(&local_20,log_00,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  tcu::TestLog::operator<<(&local_200,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_200,(char (*) [16])"Context count: ");
  local_208 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_208);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_200);
  tcu::TestLog::operator<<(&local_388,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_388,(char (*) [17])"Surfaces count: ");
  local_390 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_surfaces);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_390);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_388);
  tcu::TestLog::operator<<(&local_510,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_510,(char (*) [15])"Sample count: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&(this->m_spec).sampleCount);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_510);
  tcu::TestLog::operator<<(&local_690,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_690,(char (*) [18])"Iteration count: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&(this->m_spec).iterationCount);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_690);
  tcu::TestLog::operator<<(&local_810,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_810,(char (*) [15])"Window count: ");
  local_818 = std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::size
                        (&this->m_windows);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_818);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_810);
  tcu::TestLog::operator<<(&local_998,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_998,(char (*) [15])"Pixmap count: ");
  local_9a0 = std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::size
                        (&this->m_pixmaps);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_9a0);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_998);
  tcu::TestLog::operator<<(&local_b20,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_b20,(char (*) [16])"PBuffer count: ");
  sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_surfaces);
  sVar3 = std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::size
                    (&this->m_windows);
  sVar4 = std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::size
                    (&this->m_pixmaps);
  local_b28 = (sVar2 - sVar3) - sVar4;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_b28);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b20);
  if (((this->m_spec).release & 1U) != 0) {
    tcu::TestLog::operator<<(&local_ca8,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_ca8,
                        (char (*) [100])
                        "Context is released after each use. Both binding and releasing context are included in result time."
                       );
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_ca8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return;
}

Assistant:

void MakeCurrentPerfCase::logTestInfo (void)
{
	TestLog& log = m_testCtx.getLog();

	{
		tcu::ScopedLogSection	section(log, "Test Info", "Test case information.");

		log << TestLog::Message << "Context count: "	<< m_contexts.size()											<< TestLog::EndMessage;
		log << TestLog::Message << "Surfaces count: "	<< m_surfaces.size()											<< TestLog::EndMessage;
		log << TestLog::Message << "Sample count: "	<< m_spec.sampleCount												<< TestLog::EndMessage;
		log << TestLog::Message << "Iteration count: "	<< m_spec.iterationCount										<< TestLog::EndMessage;
		log << TestLog::Message << "Window count: "	<< m_windows.size()													<< TestLog::EndMessage;
		log << TestLog::Message << "Pixmap count: "	<< m_pixmaps.size()													<< TestLog::EndMessage;
		log << TestLog::Message << "PBuffer count: "	<< (m_surfaces.size() - m_windows.size() - m_pixmaps.size())	<< TestLog::EndMessage;

		if (m_spec.release)
			log << TestLog::Message << "Context is released after each use. Both binding and releasing context are included in result time." << TestLog::EndMessage;
	}
}